

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O2

bool test_uintwide_t_edge::test_ops_n_half_by_n_half(void)

{
  undefined1 auVar1 [16];
  bool bVar2;
  enable_if_t<std::is_integral<int>::value,_bool> eVar3;
  uint uVar4;
  uint_fast8_t in_CL;
  undefined7 in_register_00000009;
  bool bVar5;
  uint_fast8_t i;
  byte k;
  int iVar6;
  char cVar7;
  bool bVar8;
  uintwide_t<128U,_unsigned_short,_void,_false> left_half;
  uintwide_t<128U,_unsigned_short,_void,_false> right_half;
  uintwide_t<128U,_unsigned_short,_void,_false> prod_half;
  uintwide_t<128U,_unsigned_short,_void,_false> x_half;
  uintwide_t<128U,_unsigned_short,_void,_true> x_half_signed;
  uintwide_t<256U,_unsigned_short,_void,_false> prod_ctrl;
  
  bVar5 = true;
  iVar6 = 0x18;
  while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
    left_half = generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                          (true,hex,0xf);
    right_half = generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                           (true,hex,0xf);
    prod_half = math::wide_integer::operator*(&left_half,&right_half);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,&left_half);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half,&right_half);
    math::wide_integer::operator*
              (&prod_ctrl,(uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,
               (uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,&prod_half);
    bVar8 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,&prod_ctrl);
    bVar5 = (bool)(bVar5 & bVar8);
  }
  uVar4 = 2;
  while( true ) {
    right_half.values.super_array<unsigned_short,_8UL>.elems[0] = (short)uVar4;
    right_half.values.super_array<unsigned_short,_8UL>.elems[1] = (short)(uVar4 >> 0x10);
    if (7 < uVar4) break;
    x_half = generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                       (true,hex,4);
    left_half = math::wide_integer::pow<unsigned_int,128u,unsigned_short,void,false>
                          (&x_half,(uint *)&right_half);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,&x_half);
    math::wide_integer::pow<unsigned_int,256u,unsigned_short,void,false>
              (&prod_ctrl,(wide_integer *)&x_half_signed,
               (uintwide_t<256U,_unsigned_short,_void,_false> *)&right_half,
               (uint *)CONCAT71(in_register_00000009,in_CL));
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,&left_half);
    bVar8 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,&prod_ctrl);
    bVar5 = (bool)(bVar5 & bVar8);
    uVar4 = right_half.values.super_array<unsigned_short,_8UL>.elems._0_4_ + 1;
  }
  iVar6 = 8;
  while (bVar8 = bVar5, bVar5 = iVar6 != 0, iVar6 = iVar6 + -1, bVar5) {
    left_half = generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                          (true,dec,0x26);
    prod_ctrl.values.super_array<unsigned_short,_16UL>.elems._0_16_ =
         generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                   (true,dec,0x26);
    math::wide_integer::uintwide_t<128U,_unsigned_short,_void,_false>::
    uintwide_t<256U,_false,_nullptr>
              ((uintwide_t<128U,_unsigned_short,_void,_false> *)&x_half_signed,
               &zero_as_small_unsigned_type::local_zero_as_small_unsigned_type);
    right_half = math::wide_integer::operator*
                           ((uintwide_t<128U,_unsigned_short,_void,_false> *)&prod_ctrl,
                            (uintwide_t<128U,_unsigned_short,_void,_false> *)&x_half_signed);
    prod_half = math::wide_integer::
                pow<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>,128u,unsigned_short,void,false>
                          (&left_half,&right_half);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,&left_half);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half,&right_half);
    math::wide_integer::
    pow<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>,256u,unsigned_short,void,false>
              (&prod_ctrl,(wide_integer *)&x_half_signed,
               (uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half,
               (uintwide_t<256U,_unsigned_short,_void,_false> *)CONCAT71(in_register_00000009,in_CL)
              );
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,&prod_half);
    bVar2 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,&prod_ctrl);
    bVar5 = false;
    if (bVar2) {
      x_half.values.super_array<unsigned_short,_8UL>.elems[0] = 1;
      x_half.values.super_array<unsigned_short,_8UL>.elems[1] = 0;
      eVar3 = math::wide_integer::operator==(&prod_half,(int *)&x_half);
      bVar5 = (bool)(eVar3 & bVar8);
    }
  }
  for (k = 3; k != 0xe; k = k + 1) {
    x_half = generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                       (true,dec,0x26);
    left_half = math::wide_integer::rootk<128u,unsigned_short,void,false>(&x_half,k);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,&x_half);
    math::wide_integer::rootk<256u,unsigned_short,void,false>
              (&prod_ctrl,(wide_integer *)&x_half_signed,
               (uintwide_t<256U,_unsigned_short,_void,_false> *)(ulong)k,in_CL);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,&left_half);
    bVar5 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,&prod_ctrl);
    bVar8 = (bool)(bVar8 & bVar5);
  }
  for (iVar6 = 2; iVar6 != 0x28; iVar6 = iVar6 + 1) {
    x_half = generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                       (true,dec,0x26);
    left_half.values.super_array<unsigned_short,_8UL>.elems =
         (representation_type)math::wide_integer::operator>>(&x_half,iVar6);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,&x_half);
    math::wide_integer::operator>>
              (&prod_ctrl,(uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,iVar6);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,&left_half);
    bVar5 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,&prod_ctrl);
    bVar8 = (bool)(bVar8 & bVar5);
  }
  for (iVar6 = 0x3ea; iVar6 != 0x3f4; iVar6 = iVar6 + 1) {
    x_half = generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                       (true,dec,0x26);
    left_half.values.super_array<unsigned_short,_8UL>.elems =
         (representation_type)math::wide_integer::operator>>(&x_half,iVar6);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,&x_half);
    math::wide_integer::operator>>
              (&prod_ctrl,(uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,iVar6);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,&left_half);
    bVar2 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,&prod_ctrl);
    bVar5 = false;
    if (bVar2) {
      auVar1._12_4_ = 0;
      auVar1._0_2_ = right_half.values.super_array<unsigned_short,_8UL>.elems[2];
      auVar1._2_2_ = right_half.values.super_array<unsigned_short,_8UL>.elems[3];
      auVar1._4_2_ = right_half.values.super_array<unsigned_short,_8UL>.elems[4];
      auVar1._6_2_ = right_half.values.super_array<unsigned_short,_8UL>.elems[5];
      auVar1._8_2_ = right_half.values.super_array<unsigned_short,_8UL>.elems[6];
      auVar1._10_2_ = right_half.values.super_array<unsigned_short,_8UL>.elems[7];
      right_half.values.super_array<unsigned_short,_8UL>.elems =
           (representation_type)(auVar1 << 0x20);
      eVar3 = math::wide_integer::operator==(&left_half,(int *)&right_half);
      bVar5 = (bool)(eVar3 & bVar8);
    }
    bVar8 = bVar5;
  }
  iVar6 = 0x18;
  while (bVar5 = iVar6 != 0, iVar6 = iVar6 + -1, bVar5) {
    left_half = generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                          (true,dec,0x26);
    right_half = generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                           (true,dec,0x26);
    prod_half = math::wide_integer::operator^(&left_half,&right_half);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,&left_half);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half,&right_half);
    math::wide_integer::operator^
              (&prod_ctrl,(uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,
               (uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,&prod_half);
    bVar5 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,&prod_ctrl);
    bVar8 = (bool)(bVar8 & bVar5);
  }
  iVar6 = 0x20;
  while (bVar5 = iVar6 != 0, iVar6 = iVar6 + -1, bVar5) {
    left_half = generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                          (true,dec,0x26);
    right_half = generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                           (true,dec,0x26);
    prod_half = math::wide_integer::gcd<128u,unsigned_short,void,false>(&left_half,&right_half);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,&left_half);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half,&right_half);
    math::wide_integer::gcd<256u,unsigned_short,void,false>
              (&prod_ctrl,(wide_integer *)&x_half_signed,
               (uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half,
               (uintwide_t<256U,_unsigned_short,_void,_false> *)CONCAT71(in_register_00000009,in_CL)
              );
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,&prod_half);
    bVar5 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)&x_half_signed,&prod_ctrl);
    bVar8 = (bool)(bVar8 & bVar5);
  }
  cVar7 = ' ';
  while (bVar5 = cVar7 != '\0', cVar7 = cVar7 + -1, bVar5) {
    x_half_signed =
         generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,true>>
                   (false,dec,0x1f);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_true,_nullptr>(&prod_ctrl,&x_half_signed);
    math::wide_integer::uintwide_t<128U,_unsigned_short,_void,_true>::
    uintwide_t<256U,_false,_nullptr>
              ((uintwide_t<128U,_unsigned_short,_void,_true> *)&x_half,&prod_ctrl);
    bVar5 = math::wide_integer::uintwide_t<128U,_unsigned_short,_void,_true>::operator==
                      (&x_half_signed,(uintwide_t<128U,_unsigned_short,_void,_true> *)&x_half);
    bVar8 = (bool)(bVar8 & bVar5);
  }
  return bVar8;
}

Assistant:

auto test_ops_n_half_by_n_half() -> bool
{
  auto result_is_ok = true;

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT8_C(24));
           ++i)
  {
    const auto left_half =
      generate_wide_integer_value<local_uintwide_t_half_unsigned_type>
      (
        true,
        local_base::hex,
        static_cast<int>
        (
            static_cast<int>(std::numeric_limits<local_uintwide_t_half_unsigned_type>::digits / 8)
          - static_cast<int>(INT8_C(1))
        )
      );

    const auto right_half =
      generate_wide_integer_value<local_uintwide_t_half_unsigned_type>
      (
        true,
        local_base::hex,
        static_cast<int>
        (
            static_cast<int>(std::numeric_limits<local_uintwide_t_half_unsigned_type>::digits / 8)
          - static_cast<int>(INT8_C(1))
        )
      );

    const auto prod_half = left_half * right_half;
    const auto prod_ctrl =   local_uintwide_t_small_unsigned_type(left_half)
                           * local_uintwide_t_small_unsigned_type(right_half);


    const auto result_multiply_is_ok = (local_uintwide_t_small_unsigned_type(prod_half) == prod_ctrl);

    result_is_ok = (result_multiply_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(2));
             i < static_cast<unsigned>(UINT8_C(8));
           ++i)
  {
    const auto x_half =
      generate_wide_integer_value<local_uintwide_t_half_unsigned_type>
      (
        true,
        local_base::hex,
        static_cast<int>(INT8_C(4))
      );

    const auto pow_half = pow(x_half, i);

    const auto pow_ctrl = pow(local_uintwide_t_small_unsigned_type(x_half), i);

    const auto result_pow_is_ok = (local_uintwide_t_small_unsigned_type(pow_half) == pow_ctrl);

    result_is_ok = (result_pow_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT8_C(8));
           ++i)
  {
    const auto arg_half  =   generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto zero_half =   generate_wide_integer_value<local_uintwide_t_half_unsigned_type>()
                           * local_uintwide_t_half_unsigned_type(zero_as_small_unsigned_type());

    const auto pow_zero_half = pow(arg_half, zero_half);

    const auto pow_zero_ctrl = pow(local_uintwide_t_small_unsigned_type(arg_half), local_uintwide_t_small_unsigned_type(zero_half));

    const auto result_pow_zero_is_ok = ((local_uintwide_t_small_unsigned_type(pow_zero_half) == pow_zero_ctrl) && (pow_zero_half == 1));

    result_is_ok = (result_pow_zero_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<std::uint_fast8_t>(UINT8_C(3));
             i < static_cast<std::uint_fast8_t>(UINT8_C(14));
           ++i)
  {
    const auto x_half =
      generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto rootk_half = rootk(x_half, i);

    const auto rootk_ctrl = rootk(local_uintwide_t_small_unsigned_type(x_half), i);

    const auto result_rootk_is_ok = (local_uintwide_t_small_unsigned_type(rootk_half) == rootk_ctrl);

    result_is_ok = (result_rootk_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<signed>(INT8_C(2));
             i < static_cast<signed>(INT8_C(40));
           ++i)
  {
    const auto x_half = generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto shr_half = x_half >> i;

    const auto shr_ctrl = local_uintwide_t_small_unsigned_type(x_half) >> i;

    const auto result_shr_is_ok = (local_uintwide_t_small_unsigned_type(shr_half) == shr_ctrl);

    result_is_ok = (result_shr_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<signed>(INT16_C(1002));
             i < static_cast<signed>(INT16_C(1012));
           ++i)
  {
    const auto x_half = generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto shr_half = x_half >> i;

    const auto shr_ctrl = local_uintwide_t_small_unsigned_type(x_half) >> i;

    const auto result_shr_is_ok = ((local_uintwide_t_small_unsigned_type(shr_half) == shr_ctrl) && (shr_half == 0));

    result_is_ok = (result_shr_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT8_C(24));
           ++i)
  {
    const auto left_half = generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto right_half = generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto xor_half = left_half ^ right_half;
    const auto xor_ctrl = (  local_uintwide_t_small_unsigned_type(left_half)
                           ^ local_uintwide_t_small_unsigned_type(right_half));


    const auto result_xor_is_ok = (local_uintwide_t_small_unsigned_type(xor_half) == xor_ctrl);

    result_is_ok = (result_xor_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT8_C(32));
           ++i)
  {
    const auto left_half  = generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();
    const auto right_half = generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto gcd_half = gcd(left_half, right_half);
    const auto gcd_ctrl = gcd(local_uintwide_t_small_unsigned_type(left_half), local_uintwide_t_small_unsigned_type(right_half));

    const auto result_gcd_is_ok = (local_uintwide_t_small_unsigned_type(gcd_half) == gcd_ctrl);

    result_is_ok = (result_gcd_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<std::uint_fast8_t>(UINT8_C(0));
             i < static_cast<std::uint_fast8_t>(UINT8_C(32));
           ++i)
  {
    const auto x_half_signed =
      generate_wide_integer_value<local_uintwide_t_half_signed_type>
      (
        false,
        local_base::dec,
        static_cast<int>(std::numeric_limits<local_uintwide_t_half_signed_type>::digits10 - 7)
      );

    const auto x_small_unsigned = local_uintwide_t_small_unsigned_type(x_half_signed);
    const auto x_ctrl_signed    = static_cast<local_uintwide_t_half_signed_type>(x_small_unsigned);

    const auto result_convert_is_ok = (x_half_signed == x_ctrl_signed);

    result_is_ok = (result_convert_is_ok && result_is_ok);
  }

  return result_is_ok;
}